

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyTable.cpp
# Opt level: O0

Var Js::WebAssemblyTable::EntryGrow(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  ScriptContext *pSVar3;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar4;
  Var pvVar5;
  JavascriptLibrary *this_00;
  Recycler *pRVar6;
  RecyclableObject *local_c0;
  TrackAllocData local_98;
  WriteBarrierPtr<void> *local_70;
  Type *newValues;
  uint32 newLength;
  uint32 delta;
  Var deltaVar;
  WebAssemblyTable *pWStack_50;
  uint32 oldLength;
  WebAssemblyTable *table;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar3 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar3);
  pSVar3 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar3,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyTable.cpp"
                                ,0x5a,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  table = (WebAssemblyTable *)RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyTable.cpp"
                                ,0x5d,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (((ulong)scriptContext & 0xffffff) != 0) {
    pvVar5 = Arguments::operator[]((Arguments *)&scriptContext,0);
    bVar2 = VarIs<Js::WebAssemblyTable>(pvVar5);
    if (bVar2) {
      pvVar5 = Arguments::operator[]((Arguments *)&scriptContext,0);
      pWStack_50 = VarTo<Js::WebAssemblyTable>(pvVar5);
      deltaVar._4_4_ = pWStack_50->m_currentLength;
      if (((uint)scriptContext & 0xffffff) < 2) {
        this_00 = ScriptContext::GetLibrary((ScriptContext *)table);
        local_c0 = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
      }
      else {
        local_c0 = (RecyclableObject *)Arguments::operator[]((Arguments *)&scriptContext,1);
      }
      _newLength = local_c0;
      newValues._4_4_ = WebAssembly::ToNonWrappingUint32(local_c0,(ScriptContext *)table);
      if (newValues._4_4_ != 0) {
        newValues._0_4_ = 0;
        bVar2 = UInt32Math::Add(pWStack_50->m_currentLength,newValues._4_4_,(uint32 *)&newValues);
        if ((bVar2) || (pWStack_50->m_maxLength < (Type)newValues)) {
          JavascriptError::ThrowRangeError((ScriptContext *)table,-0x7ff5ebf6,(PCWSTR)0x0);
        }
        pRVar6 = ScriptContext::GetRecycler((ScriptContext *)table);
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_98,(type_info *)&Memory::WriteBarrierPtr<void>::typeinfo,0,
                   (ulong)(Type)newValues,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyTable.cpp"
                   ,0x70);
        pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_98);
        local_70 = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
                             ((Memory *)pRVar6,(Recycler *)Memory::Recycler::AllocZero,0,
                              (ulong)(Type)newValues);
        Memory::
        CopyArray<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>,Memory::Recycler>
                  (local_70,(ulong)(Type)newValues,&pWStack_50->m_values,
                   (ulong)pWStack_50->m_currentLength);
        Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::operator=
                  (&pWStack_50->m_values,local_70);
        pWStack_50->m_currentLength = (Type)newValues;
      }
      pvVar5 = JavascriptNumber::ToVar(deltaVar._4_4_,(ScriptContext *)table);
      return pvVar5;
    }
  }
  JavascriptError::ThrowTypeError((ScriptContext *)table,-0x7ff5e49c,(PCWSTR)0x0);
}

Assistant:

Var
WebAssemblyTable::EntryGrow(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    if (args.Info.Count == 0 || !VarIs<WebAssemblyTable>(args[0]))
    {
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedTableObject);
    }
    WebAssemblyTable * table = VarTo<WebAssemblyTable>(args[0]);
    uint32 oldLength = table->m_currentLength;

    Var deltaVar = args.Info.Count >= 2 ? args[1] : scriptContext->GetLibrary()->GetUndefined();
    uint32 delta = WebAssembly::ToNonWrappingUint32(deltaVar, scriptContext);
    if (delta > 0)
    {
        uint32 newLength = 0;
        if (UInt32Math::Add(table->m_currentLength, delta, &newLength) || newLength > table->m_maxLength)
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange);
        }

        Field(Var) * newValues = RecyclerNewArrayZ(scriptContext->GetRecycler(), Field(Var), newLength);
        CopyArray(newValues, newLength, table->m_values, table->m_currentLength);

        table->m_values = newValues;
        table->m_currentLength = newLength;
    }

    return JavascriptNumber::ToVar(oldLength, scriptContext);
}